

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar32 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  uint uVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  long lStack_2670;
  byte local_2658;
  undefined1 local_2618 [16];
  ulong local_2608;
  ulong local_2600;
  StackItemT<embree::NodeRefPtr<8>_> *local_25f8;
  Scene *local_25f0;
  RTCFilterFunctionNArguments args;
  float local_2568 [4];
  float local_2558 [4];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_25f8 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar73 = ZEXT3264(auVar45);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar74 = ZEXT3264(auVar46);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar75 = ZEXT3264(auVar47);
  auVar32 = vmulss_avx512f(auVar45._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar54 = auVar32._0_4_;
  auVar45._4_4_ = uVar54;
  auVar45._0_4_ = uVar54;
  auVar45._8_4_ = uVar54;
  auVar45._12_4_ = uVar54;
  auVar45._16_4_ = uVar54;
  auVar45._20_4_ = uVar54;
  auVar45._24_4_ = uVar54;
  auVar45._28_4_ = uVar54;
  auVar32 = vmulss_avx512f(auVar46._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar54 = auVar32._0_4_;
  auVar46._4_4_ = uVar54;
  auVar46._0_4_ = uVar54;
  auVar46._8_4_ = uVar54;
  auVar46._12_4_ = uVar54;
  auVar46._16_4_ = uVar54;
  auVar46._20_4_ = uVar54;
  auVar46._24_4_ = uVar54;
  auVar46._28_4_ = uVar54;
  auVar32 = vmulss_avx512f(auVar47._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar54 = auVar32._0_4_;
  auVar47._4_4_ = uVar54;
  auVar47._0_4_ = uVar54;
  auVar47._8_4_ = uVar54;
  auVar47._12_4_ = uVar54;
  auVar47._16_4_ = uVar54;
  auVar47._20_4_ = uVar54;
  auVar47._24_4_ = uVar54;
  auVar47._28_4_ = uVar54;
  local_2600 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = local_2600 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar58 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  auVar48._16_4_ = 0x80000000;
  auVar48._20_4_ = 0x80000000;
  auVar48._24_4_ = 0x80000000;
  auVar48._28_4_ = 0x80000000;
  auVar45 = vxorps_avx512vl(auVar45,auVar48);
  auVar76 = ZEXT3264(auVar45);
  auVar45 = vxorps_avx512vl(auVar46,auVar48);
  auVar77 = ZEXT3264(auVar45);
  auVar45 = vxorps_avx512vl(auVar47,auVar48);
  auVar78 = ZEXT3264(auVar45);
  auVar45 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT3264(auVar45);
  auVar32 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar80 = ZEXT1664(auVar32);
  auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar81 = ZEXT3264(auVar45);
  auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar82 = ZEXT3264(auVar45);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar83 = ZEXT1664(auVar32);
  auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar84 = ZEXT3264(auVar45);
  auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
  auVar86 = ZEXT3264(auVar45);
LAB_01d8c11e:
  do {
    if (local_25f8 == stack) {
      return;
    }
    pSVar18 = local_25f8 + -1;
    local_25f8 = local_25f8 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar18->dist);
  sVar27 = (local_25f8->ptr).ptr;
LAB_01d8c140:
  do {
    if ((sVar27 & 8) != 0) break;
    auVar45 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + local_2600),auVar76._0_32_,
                         auVar73._0_32_);
    auVar46 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + uVar24),auVar77._0_32_,
                         auVar74._0_32_);
    auVar45 = vpmaxsd_avx2(auVar45,auVar46);
    auVar46 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + uVar29),auVar78._0_32_,
                         auVar75._0_32_);
    auVar46 = vpmaxsd_avx512vl(auVar46,auVar79._0_32_);
    auVar45 = vpmaxsd_avx2(auVar45,auVar46);
    auVar46 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + uVar25),auVar76._0_32_,
                         auVar73._0_32_);
    auVar47 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + (uVar24 ^ 0x20)),auVar77._0_32_,
                         auVar74._0_32_);
    auVar46 = vpminsd_avx2(auVar46,auVar47);
    auVar47 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar27 + 0x40 + (uVar29 ^ 0x20)),auVar78._0_32_,
                         auVar75._0_32_);
    auVar47 = vpminsd_avx2(auVar47,auVar58._0_32_);
    auVar46 = vpminsd_avx2(auVar46,auVar47);
    uVar28 = vpcmpd_avx512vl(auVar45,auVar46,2);
    bVar21 = (byte)uVar28;
    if (bVar21 == 0) goto LAB_01d8c11e;
    auVar46 = *(undefined1 (*) [32])(sVar27 & 0xfffffffffffffff0);
    auVar47 = ((undefined1 (*) [32])(sVar27 & 0xfffffffffffffff0))[1];
    auVar48 = vmovdqa64_avx512vl(auVar81._0_32_);
    auVar48 = vpternlogd_avx512vl(auVar48,auVar45,auVar82._0_32_,0xf8);
    auVar49 = vpcompressd_avx512vl(auVar48);
    auVar50._0_4_ = (uint)(bVar21 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar48._0_4_;
    bVar30 = (bool)((byte)(uVar28 >> 1) & 1);
    auVar50._4_4_ = (uint)bVar30 * auVar49._4_4_ | (uint)!bVar30 * auVar48._4_4_;
    bVar30 = (bool)((byte)(uVar28 >> 2) & 1);
    auVar50._8_4_ = (uint)bVar30 * auVar49._8_4_ | (uint)!bVar30 * auVar48._8_4_;
    bVar30 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar50._12_4_ = (uint)bVar30 * auVar49._12_4_ | (uint)!bVar30 * auVar48._12_4_;
    bVar30 = (bool)((byte)(uVar28 >> 4) & 1);
    auVar50._16_4_ = (uint)bVar30 * auVar49._16_4_ | (uint)!bVar30 * auVar48._16_4_;
    bVar30 = (bool)((byte)(uVar28 >> 5) & 1);
    auVar50._20_4_ = (uint)bVar30 * auVar49._20_4_ | (uint)!bVar30 * auVar48._20_4_;
    bVar30 = (bool)((byte)(uVar28 >> 6) & 1);
    auVar50._24_4_ = (uint)bVar30 * auVar49._24_4_ | (uint)!bVar30 * auVar48._24_4_;
    bVar30 = SUB81(uVar28 >> 7,0);
    auVar50._28_4_ = (uint)bVar30 * auVar49._28_4_ | (uint)!bVar30 * auVar48._28_4_;
    auVar48 = vpermt2q_avx512vl(auVar46,auVar50,auVar47);
    sVar27 = auVar48._0_8_;
    bVar21 = bVar21 - 1 & bVar21;
    if (bVar21 != 0) {
      auVar48 = vpshufd_avx2(auVar50,0x55);
      vpermt2q_avx512vl(auVar46,auVar48,auVar47);
      auVar49 = vpminsd_avx2(auVar50,auVar48);
      auVar48 = vpmaxsd_avx2(auVar50,auVar48);
      bVar21 = bVar21 - 1 & bVar21;
      if (bVar21 == 0) {
        auVar50 = vpermi2q_avx512vl(auVar49,auVar46,auVar47);
        sVar27 = auVar50._0_8_;
        auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
        (local_25f8->ptr).ptr = auVar46._0_8_;
        lVar19 = 8;
        lStack_2670 = 0x10;
        auVar53 = auVar48;
      }
      else {
        auVar53 = vpshufd_avx2(auVar50,0xaa);
        vpermt2q_avx512vl(auVar46,auVar53,auVar47);
        auVar52 = vpminsd_avx2(auVar49,auVar53);
        auVar49 = vpmaxsd_avx2(auVar49,auVar53);
        auVar53 = vpminsd_avx2(auVar48,auVar49);
        auVar48 = vpmaxsd_avx2(auVar48,auVar49);
        bVar21 = bVar21 - 1 & bVar21;
        if (bVar21 == 0) {
          auVar50 = vpermi2q_avx512vl(auVar52,auVar46,auVar47);
          sVar27 = auVar50._0_8_;
          auVar50 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
          (local_25f8->ptr).ptr = auVar50._0_8_;
          auVar48 = vpermd_avx2(auVar48,auVar45);
          local_25f8->dist = auVar48._0_4_;
          auVar46 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
          local_25f8[1].ptr.ptr = auVar46._0_8_;
          lStack_2670 = 0x18;
          lVar19 = lStack_2670;
          lStack_2670 = 0x20;
        }
        else {
          auVar49 = vpshufd_avx2(auVar50,0xff);
          vpermt2q_avx512vl(auVar46,auVar49,auVar47);
          auVar85 = vpminsd_avx2(auVar52,auVar49);
          auVar49 = vpmaxsd_avx2(auVar52,auVar49);
          auVar52 = vpminsd_avx2(auVar53,auVar49);
          auVar49 = vpmaxsd_avx2(auVar53,auVar49);
          auVar53 = vpminsd_avx2(auVar48,auVar49);
          auVar48 = vpmaxsd_avx2(auVar48,auVar49);
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 != 0) {
            auVar51 = valignd_avx512vl(auVar50,auVar50,3);
            auVar49 = vmovdqa64_avx512vl(auVar84._0_32_);
            auVar50 = vpermt2d_avx512vl(auVar83._0_32_,auVar84._0_32_,auVar85);
            auVar85 = auVar86._0_32_;
            auVar50 = vpermt2d_avx512vl(auVar50,auVar85,auVar52);
            auVar52 = vmovdqa64_avx512vl(auVar85);
            auVar53 = vpermt2d_avx512vl(auVar50,auVar85,auVar53);
            auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar48 = vpermt2d_avx512vl(auVar53,auVar50,auVar48);
            auVar84 = ZEXT3264(auVar48);
            bVar20 = bVar21;
            do {
              auVar50 = auVar84._0_32_;
              auVar53._8_4_ = 1;
              auVar53._0_8_ = 0x100000001;
              auVar53._12_4_ = 1;
              auVar53._16_4_ = 1;
              auVar53._20_4_ = 1;
              auVar53._24_4_ = 1;
              auVar53._28_4_ = 1;
              auVar48 = vpermd_avx2(auVar53,auVar51);
              auVar51 = valignd_avx512vl(auVar51,auVar51,1);
              vpermt2q_avx512vl(auVar46,auVar51,auVar47);
              bVar20 = bVar20 - 1 & bVar20;
              uVar13 = vpcmpd_avx512vl(auVar48,auVar50,5);
              auVar48 = vpmaxsd_avx2(auVar48,auVar50);
              bVar14 = (byte)uVar13 << 1;
              auVar50 = valignd_avx512vl(auVar50,auVar50,7);
              bVar30 = (bool)((byte)uVar13 & 1);
              bVar5 = (bool)(bVar14 >> 2 & 1);
              bVar6 = (bool)(bVar14 >> 3 & 1);
              bVar7 = (bool)(bVar14 >> 4 & 1);
              bVar8 = (bool)(bVar14 >> 5 & 1);
              bVar9 = (bool)(bVar14 >> 6 & 1);
              auVar84 = ZEXT3264(CONCAT428((uint)(bVar14 >> 7) * auVar50._28_4_ |
                                           (uint)!(bool)(bVar14 >> 7) * auVar48._28_4_,
                                           CONCAT424((uint)bVar9 * auVar50._24_4_ |
                                                     (uint)!bVar9 * auVar48._24_4_,
                                                     CONCAT420((uint)bVar8 * auVar50._20_4_ |
                                                               (uint)!bVar8 * auVar48._20_4_,
                                                               CONCAT416((uint)bVar7 *
                                                                         auVar50._16_4_ |
                                                                         (uint)!bVar7 *
                                                                         auVar48._16_4_,
                                                                         CONCAT412((uint)bVar6 *
                                                                                   auVar50._12_4_ |
                                                                                   (uint)!bVar6 *
                                                                                   auVar48._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar5 * auVar50._8_4_ |
                                                  (uint)!bVar5 * auVar48._8_4_,
                                                  CONCAT44((uint)bVar30 * auVar50._4_4_ |
                                                           (uint)!bVar30 * auVar48._4_4_,
                                                           auVar48._0_4_))))))));
            } while (bVar20 != 0);
            lVar19 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
            while( true ) {
              auVar50 = auVar84._0_32_;
              auVar48 = vpermt2q_avx512vl(auVar46,auVar50,auVar47);
              sVar27 = auVar48._0_8_;
              bVar30 = lVar19 == 0;
              lVar19 = lVar19 + -1;
              if (bVar30) break;
              (local_25f8->ptr).ptr = sVar27;
              auVar48 = vpermd_avx2(auVar50,auVar45);
              local_25f8->dist = auVar48._0_4_;
              auVar48 = valignd_avx512vl(auVar50,auVar50,1);
              auVar84 = ZEXT3264(auVar48);
              local_25f8 = local_25f8 + 1;
            }
            auVar83 = ZEXT3264(auVar83._0_32_);
            auVar45 = vmovdqa64_avx512vl(auVar49);
            auVar84 = ZEXT3264(auVar45);
            auVar45 = vmovdqa64_avx512vl(auVar52);
            auVar86 = ZEXT3264(auVar45);
            goto LAB_01d8c140;
          }
          auVar50 = vpermi2q_avx512vl(auVar85,auVar46,auVar47);
          sVar27 = auVar50._0_8_;
          auVar50 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
          (local_25f8->ptr).ptr = auVar50._0_8_;
          auVar48 = vpermd_avx2(auVar48,auVar45);
          local_25f8->dist = auVar48._0_4_;
          auVar48 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
          local_25f8[1].ptr.ptr = auVar48._0_8_;
          auVar48 = vpermd_avx2(auVar53,auVar45);
          local_25f8[1].dist = auVar48._0_4_;
          auVar46 = vpermt2q_avx512vl(auVar46,auVar52,auVar47);
          local_25f8[2].ptr.ptr = auVar46._0_8_;
          lStack_2670 = 0x28;
          lVar19 = lStack_2670;
          lStack_2670 = 0x30;
          auVar53 = auVar52;
        }
      }
      auVar45 = vpermd_avx2(auVar53,auVar45);
      *(int *)((long)&(local_25f8->ptr).ptr + lVar19) = auVar45._0_4_;
      local_25f8 = (StackItemT<embree::NodeRefPtr<8>_> *)
                   ((long)&(local_25f8->ptr).ptr + lStack_2670);
    }
  } while( true );
  uVar28 = sVar27 & 0xfffffffffffffff0;
  for (lVar19 = 0; lVar19 != (ulong)((uint)sVar27 & 0xf) - 8; lVar19 = lVar19 + 1) {
    lVar26 = lVar19 * 0xb0;
    auVar32 = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar26);
    auVar64 = *(undefined1 (*) [16])(uVar28 + 0x40 + lVar26);
    auVar63 = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar26);
    auVar42 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar26);
    auVar33._0_4_ = auVar64._0_4_ * auVar32._0_4_;
    auVar33._4_4_ = auVar64._4_4_ * auVar32._4_4_;
    auVar33._8_4_ = auVar64._8_4_ * auVar32._8_4_;
    auVar33._12_4_ = auVar64._12_4_ * auVar32._12_4_;
    auVar65 = *(undefined1 (*) [16])(uVar28 + 0x60 + lVar26);
    auVar66 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar26);
    local_2538 = vfmsub231ps_fma(auVar33,auVar63,auVar42);
    auVar37._0_4_ = auVar42._0_4_ * auVar65._0_4_;
    auVar37._4_4_ = auVar42._4_4_ * auVar65._4_4_;
    auVar37._8_4_ = auVar42._8_4_ * auVar65._8_4_;
    auVar37._12_4_ = auVar42._12_4_ * auVar65._12_4_;
    local_2528 = vfmsub231ps_fma(auVar37,auVar32,auVar66);
    auVar38._0_4_ = auVar66._0_4_ * auVar63._0_4_;
    auVar38._4_4_ = auVar66._4_4_ * auVar63._4_4_;
    auVar38._8_4_ = auVar66._8_4_ * auVar63._8_4_;
    auVar38._12_4_ = auVar66._12_4_ * auVar63._12_4_;
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar41._4_4_ = uVar54;
    auVar41._0_4_ = uVar54;
    auVar41._8_4_ = uVar54;
    auVar41._12_4_ = uVar54;
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar71._4_4_ = uVar54;
    auVar71._0_4_ = uVar54;
    auVar71._8_4_ = uVar54;
    auVar71._12_4_ = uVar54;
    fVar70 = *(float *)(ray + k * 4 + 0x60);
    auVar39._4_4_ = fVar70;
    auVar39._0_4_ = fVar70;
    auVar39._8_4_ = fVar70;
    auVar39._12_4_ = fVar70;
    uVar54 = *(undefined4 *)(ray + k * 4);
    auVar36._4_4_ = uVar54;
    auVar36._0_4_ = uVar54;
    auVar36._8_4_ = uVar54;
    auVar36._12_4_ = uVar54;
    auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + lVar26),auVar36);
    local_2518 = vfmsub231ps_fma(auVar38,auVar65,auVar64);
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar34._4_4_ = uVar54;
    auVar34._0_4_ = uVar54;
    auVar34._8_4_ = uVar54;
    auVar34._12_4_ = uVar54;
    auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x10 + lVar26),auVar34);
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar35._4_4_ = uVar54;
    auVar35._0_4_ = uVar54;
    auVar35._8_4_ = uVar54;
    auVar35._12_4_ = uVar54;
    auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + lVar26),auVar35);
    auVar36 = vmulps_avx512vl(auVar71,auVar35);
    auVar37 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar39);
    auVar36 = vmulps_avx512vl(auVar39,auVar33);
    auVar38 = vfmsub231ps_avx512vl(auVar36,auVar35,auVar41);
    auVar36 = vmulps_avx512vl(auVar41,auVar34);
    auVar39 = vfmsub231ps_avx512vl(auVar36,auVar33,auVar71);
    auVar72._0_4_ = fVar70 * local_2518._0_4_;
    auVar72._4_4_ = fVar70 * local_2518._4_4_;
    auVar72._8_4_ = fVar70 * local_2518._8_4_;
    auVar72._12_4_ = fVar70 * local_2518._12_4_;
    auVar36 = vfmadd231ps_fma(auVar72,local_2528,auVar71);
    auVar36 = vfmadd231ps_fma(auVar36,local_2538,auVar41);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx512vl(auVar36,auVar40);
    auVar41 = vandps_avx512vl(auVar36,auVar83._0_16_);
    auVar32 = vmulps_avx512vl(auVar32,auVar39);
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar38,auVar63);
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar37,auVar65);
    uVar22 = auVar41._0_4_;
    auVar63._0_4_ = (float)(uVar22 ^ auVar32._0_4_);
    uVar68 = auVar41._4_4_;
    auVar63._4_4_ = (float)(uVar68 ^ auVar32._4_4_);
    uVar69 = auVar41._8_4_;
    auVar63._8_4_ = (float)(uVar69 ^ auVar32._8_4_);
    uVar23 = auVar41._12_4_;
    auVar63._12_4_ = (float)(uVar23 ^ auVar32._12_4_);
    auVar32 = vmulps_avx512vl(auVar42,auVar39);
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar64,auVar38);
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar66,auVar37);
    auVar64._0_4_ = (float)(uVar22 ^ auVar32._0_4_);
    auVar64._4_4_ = (float)(uVar68 ^ auVar32._4_4_);
    auVar64._8_4_ = (float)(uVar69 ^ auVar32._8_4_);
    auVar64._12_4_ = (float)(uVar23 ^ auVar32._12_4_);
    auVar32 = ZEXT816(0) << 0x20;
    uVar13 = vcmpps_avx512vl(auVar63,auVar32,5);
    uVar10 = vcmpps_avx512vl(auVar64,auVar32,5);
    uVar11 = vcmpps_avx512vl(auVar36,auVar32,4);
    auVar32._0_4_ = auVar63._0_4_ + auVar64._0_4_;
    auVar32._4_4_ = auVar63._4_4_ + auVar64._4_4_;
    auVar32._8_4_ = auVar63._8_4_ + auVar64._8_4_;
    auVar32._12_4_ = auVar63._12_4_ + auVar64._12_4_;
    uVar12 = vcmpps_avx512vl(auVar32,auVar40,2);
    bVar21 = (byte)uVar13 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
    if (bVar21 != 0) {
      auVar66._0_4_ = auVar35._0_4_ * local_2518._0_4_;
      auVar66._4_4_ = auVar35._4_4_ * local_2518._4_4_;
      auVar66._8_4_ = auVar35._8_4_ * local_2518._8_4_;
      auVar66._12_4_ = auVar35._12_4_ * local_2518._12_4_;
      auVar32 = vfmadd213ps_fma(auVar34,local_2528,auVar66);
      auVar32 = vfmadd213ps_fma(auVar33,local_2538,auVar32);
      uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar42._4_4_ = uVar54;
      auVar42._0_4_ = uVar54;
      auVar42._8_4_ = uVar54;
      auVar42._12_4_ = uVar54;
      auVar42 = vmulps_avx512vl(auVar40,auVar42);
      fVar70 = *(float *)(ray + k * 4 + 0x80);
      auVar65._0_4_ = (float)(uVar22 ^ auVar32._0_4_);
      auVar65._4_4_ = (float)(uVar68 ^ auVar32._4_4_);
      auVar65._8_4_ = (float)(uVar69 ^ auVar32._8_4_);
      auVar65._12_4_ = (float)(uVar23 ^ auVar32._12_4_);
      auVar67._0_4_ = fVar70 * auVar40._0_4_;
      auVar67._4_4_ = fVar70 * auVar40._4_4_;
      auVar67._8_4_ = fVar70 * auVar40._8_4_;
      auVar67._12_4_ = fVar70 * auVar40._12_4_;
      uVar13 = vcmpps_avx512vl(auVar65,auVar67,2);
      uVar10 = vcmpps_avx512vl(auVar42,auVar65,1);
      bVar21 = (byte)uVar13 & (byte)uVar10 & bVar21;
      if (bVar21 != 0) {
        local_25f0 = context->scene;
        auVar32 = vrcp14ps_avx512vl(auVar40);
        auVar15._8_4_ = 0x3f800000;
        auVar15._0_8_ = 0x3f8000003f800000;
        auVar15._12_4_ = 0x3f800000;
        auVar42 = vfnmadd213ps_avx512vl(auVar40,auVar32,auVar15);
        auVar32 = vfmadd132ps_fma(auVar42,auVar32,auVar32);
        fVar59 = auVar32._0_4_;
        local_2548._0_4_ = fVar59 * auVar65._0_4_;
        fVar60 = auVar32._4_4_;
        local_2548._4_4_ = fVar60 * auVar65._4_4_;
        fVar61 = auVar32._8_4_;
        local_2548._8_4_ = fVar61 * auVar65._8_4_;
        fVar62 = auVar32._12_4_;
        local_2548._12_4_ = fVar62 * auVar65._12_4_;
        auVar58 = ZEXT1664(local_2548);
        local_2568[0] = fVar59 * auVar63._0_4_;
        local_2568[1] = fVar60 * auVar63._4_4_;
        local_2568[2] = fVar61 * auVar63._8_4_;
        local_2568[3] = fVar62 * auVar63._12_4_;
        local_2558[0] = fVar59 * auVar64._0_4_;
        local_2558[1] = fVar60 * auVar64._4_4_;
        local_2558[2] = fVar61 * auVar64._8_4_;
        local_2558[3] = fVar62 * auVar64._12_4_;
        lVar26 = lVar26 + uVar28;
        auVar55._8_4_ = 0x7f800000;
        auVar55._0_8_ = 0x7f8000007f800000;
        auVar55._12_4_ = 0x7f800000;
        auVar32 = vblendmps_avx512vl(auVar55,local_2548);
        auVar43._0_4_ = (uint)(bVar21 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
        bVar30 = (bool)(bVar21 >> 1 & 1);
        auVar43._4_4_ = (uint)bVar30 * auVar32._4_4_ | (uint)!bVar30 * 0x7f800000;
        bVar30 = (bool)(bVar21 >> 2 & 1);
        auVar43._8_4_ = (uint)bVar30 * auVar32._8_4_ | (uint)!bVar30 * 0x7f800000;
        bVar30 = (bool)(bVar21 >> 3 & 1);
        auVar43._12_4_ = (uint)bVar30 * auVar32._12_4_ | (uint)!bVar30 * 0x7f800000;
        auVar32 = vshufps_avx(auVar43,auVar43,0xb1);
        auVar32 = vminps_avx(auVar32,auVar43);
        auVar64 = vshufpd_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar64,auVar32);
        uVar13 = vcmpps_avx512vl(auVar43,auVar32,0);
        uVar22 = (uint)bVar21;
        if (((byte)uVar13 & bVar21) != 0) {
          bVar21 = (byte)uVar13 & bVar21;
        }
        uVar68 = 0;
        for (uVar69 = (uint)bVar21; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
          uVar68 = uVar68 + 1;
        }
        do {
          uVar23 = uVar68 & 0xff;
          local_2608 = (ulong)uVar23;
          uVar69 = *(uint *)(lVar26 + 0x90 + local_2608 * 4);
          pGVar3 = (local_25f0->geometries).items[uVar69].ptr;
          local_2658 = (byte)uVar22;
          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            local_2658 = ~(byte)(1 << (uVar68 & 0x1f)) & local_2658;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar31 = (ulong)(uVar23 << 2);
              uVar54 = *(undefined4 *)((long)local_2568 + uVar31);
              uVar2 = *(undefined4 *)((long)local_2558 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2548 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2538 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2528 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2518 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar54;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar26 + 0xa0 + uVar31);
              *(uint *)(ray + k * 4 + 0x120) = uVar69;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              break;
            }
            local_2508 = auVar58._0_16_;
            auVar45 = vmovdqu64_avx512vl(auVar79._0_32_);
            uVar31 = (ulong)(uVar23 * 4);
            uVar54 = *(undefined4 *)((long)local_2568 + uVar31);
            h.u.field_0.i[1] = uVar54;
            h.u.field_0.i[0] = uVar54;
            h.u.field_0.i[2] = uVar54;
            h.u.field_0.i[3] = uVar54;
            h.v.field_0.v[0] = *(float *)((long)local_2558 + uVar31);
            h.geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl()
            ;
            uVar54 = *(undefined4 *)(lVar26 + 0xa0 + uVar31);
            h.primID.field_0.i[1] = uVar54;
            h.primID.field_0.i[0] = uVar54;
            h.primID.field_0.i[2] = uVar54;
            h.primID.field_0.i[3] = uVar54;
            uVar54 = *(undefined4 *)(local_2538 + uVar31);
            h.Ng.field_0._4_4_ = uVar54;
            h.Ng.field_0._0_4_ = uVar54;
            h.Ng.field_0._8_4_ = uVar54;
            h.Ng.field_0._12_4_ = uVar54;
            uVar54 = *(undefined4 *)(local_2528 + uVar31);
            h.Ng.field_0._20_4_ = uVar54;
            h.Ng.field_0._16_4_ = uVar54;
            h.Ng.field_0._24_4_ = uVar54;
            h.Ng.field_0._28_4_ = uVar54;
            h.Ng.field_0._32_4_ = *(undefined4 *)(local_2518 + uVar31);
            h.Ng.field_0._36_4_ = h.Ng.field_0._32_4_;
            h.Ng.field_0._40_4_ = h.Ng.field_0._32_4_;
            h.Ng.field_0._44_4_ = h.Ng.field_0._32_4_;
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                          ZEXT1632((undefined1  [16])h.u.field_0));
            h.instID[0].field_0.i[1] = context->user->instID[0];
            h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2548 + uVar31);
            auVar32 = auVar80._0_16_;
            local_2618 = vmovdqa64_avx512vl(auVar32);
            args.valid = (int *)local_2618;
            args.geometryUserPtr = pGVar3->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            local_24f8 = vmovdqa64_avx512vl(auVar32);
            auVar32 = vmovdqa64_avx512vl(auVar32);
            args.ray = (RTCRayN *)ray;
            if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar3->intersectionFilterN)(&args);
              auVar32 = local_2618;
            }
            uVar31 = vptestmd_avx512vl(auVar32,auVar32);
            if ((uVar31 & 0xf) == 0) {
LAB_01d8cae8:
              *(float *)(ray + k * 4 + 0x80) = fVar70;
            }
            else {
              p_Var4 = context->args->filter;
              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var4)(&args);
                auVar32 = local_2618;
              }
              uVar31 = vptestmd_avx512vl(auVar32,auVar32);
              uVar31 = uVar31 & 0xf;
              bVar21 = (byte)uVar31;
              if (bVar21 == 0) goto LAB_01d8cae8;
              iVar1 = *(int *)(args.hit + 4);
              iVar16 = *(int *)(args.hit + 8);
              iVar17 = *(int *)(args.hit + 0xc);
              bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar6 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xc0) =
                   (uint)(bVar21 & 1) * *(int *)args.hit |
                   (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xc0);
              *(uint *)(args.ray + 0xc4) =
                   (uint)bVar30 * iVar1 | (uint)!bVar30 * *(int *)(args.ray + 0xc4);
              *(uint *)(args.ray + 200) =
                   (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 200);
              *(uint *)(args.ray + 0xcc) =
                   (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xcc);
              iVar1 = *(int *)(args.hit + 0x14);
              iVar16 = *(int *)(args.hit + 0x18);
              iVar17 = *(int *)(args.hit + 0x1c);
              bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar6 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xd0) =
                   (uint)(bVar21 & 1) * *(int *)(args.hit + 0x10) |
                   (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xd0);
              *(uint *)(args.ray + 0xd4) =
                   (uint)bVar30 * iVar1 | (uint)!bVar30 * *(int *)(args.ray + 0xd4);
              *(uint *)(args.ray + 0xd8) =
                   (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xd8);
              *(uint *)(args.ray + 0xdc) =
                   (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xdc);
              iVar1 = *(int *)(args.hit + 0x24);
              iVar16 = *(int *)(args.hit + 0x28);
              iVar17 = *(int *)(args.hit + 0x2c);
              bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar6 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xe0) =
                   (uint)(bVar21 & 1) * *(int *)(args.hit + 0x20) |
                   (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xe0);
              *(uint *)(args.ray + 0xe4) =
                   (uint)bVar30 * iVar1 | (uint)!bVar30 * *(int *)(args.ray + 0xe4);
              *(uint *)(args.ray + 0xe8) =
                   (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xe8);
              *(uint *)(args.ray + 0xec) =
                   (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xec);
              iVar1 = *(int *)(args.hit + 0x34);
              iVar16 = *(int *)(args.hit + 0x38);
              iVar17 = *(int *)(args.hit + 0x3c);
              bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar6 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xf0) =
                   (uint)(bVar21 & 1) * *(int *)(args.hit + 0x30) |
                   (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xf0);
              *(uint *)(args.ray + 0xf4) =
                   (uint)bVar30 * iVar1 | (uint)!bVar30 * *(int *)(args.ray + 0xf4);
              *(uint *)(args.ray + 0xf8) =
                   (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xf8);
              *(uint *)(args.ray + 0xfc) =
                   (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xfc);
              iVar1 = *(int *)(args.hit + 0x44);
              iVar16 = *(int *)(args.hit + 0x48);
              iVar17 = *(int *)(args.hit + 0x4c);
              bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar6 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0x100) =
                   (uint)(bVar21 & 1) * *(int *)(args.hit + 0x40) |
                   (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0x100);
              *(uint *)(args.ray + 0x104) =
                   (uint)bVar30 * iVar1 | (uint)!bVar30 * *(int *)(args.ray + 0x104);
              *(uint *)(args.ray + 0x108) =
                   (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0x108);
              *(uint *)(args.ray + 0x10c) =
                   (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0x10c);
              auVar32 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
              *(undefined1 (*) [16])(args.ray + 0x110) = auVar32;
              auVar32 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
              *(undefined1 (*) [16])(args.ray + 0x120) = auVar32;
              auVar32 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
              *(undefined1 (*) [16])(args.ray + 0x130) = auVar32;
              auVar32 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
              *(undefined1 (*) [16])(args.ray + 0x140) = auVar32;
              fVar70 = *(float *)(ray + k * 4 + 0x80);
            }
            auVar57._4_4_ = fVar70;
            auVar57._0_4_ = fVar70;
            auVar57._8_4_ = fVar70;
            auVar57._12_4_ = fVar70;
            auVar58 = ZEXT1664(local_2508);
            uVar13 = vcmpps_avx512vl(local_2508,auVar57,2);
            local_2658 = ~(byte)(1 << ((uint)local_2608 & 0x1f)) & local_2658 & (byte)uVar13;
            auVar73 = ZEXT3264(auVar73._0_32_);
            auVar74 = ZEXT3264(auVar74._0_32_);
            auVar75 = ZEXT3264(auVar75._0_32_);
            auVar76 = ZEXT3264(auVar76._0_32_);
            auVar77 = ZEXT3264(auVar77._0_32_);
            auVar78 = ZEXT3264(auVar78._0_32_);
            auVar45 = vmovdqu64_avx512vl(auVar45);
            auVar79 = ZEXT3264(auVar45);
            auVar32 = vmovdqa64_avx512vl(local_24f8);
            auVar80 = ZEXT1664(auVar32);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar81 = ZEXT3264(auVar45);
            auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar82 = ZEXT3264(auVar45);
            auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar83 = ZEXT1664(auVar32);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar84 = ZEXT3264(auVar45);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
            auVar86 = ZEXT3264(auVar45);
          }
          uVar22 = (uint)local_2658;
          if (local_2658 == 0) break;
          auVar56._8_4_ = 0x7f800000;
          auVar56._0_8_ = 0x7f8000007f800000;
          auVar56._12_4_ = 0x7f800000;
          auVar32 = vblendmps_avx512vl(auVar56,auVar58._0_16_);
          auVar44._0_4_ =
               (uint)(local_2658 & 1) * auVar32._0_4_ | (uint)!(bool)(local_2658 & 1) * 0x7f800000;
          bVar30 = (bool)(local_2658 >> 1 & 1);
          auVar44._4_4_ = (uint)bVar30 * auVar32._4_4_ | (uint)!bVar30 * 0x7f800000;
          bVar30 = (bool)(local_2658 >> 2 & 1);
          auVar44._8_4_ = (uint)bVar30 * auVar32._8_4_ | (uint)!bVar30 * 0x7f800000;
          bVar30 = (bool)(local_2658 >> 3 & 1);
          auVar44._12_4_ = (uint)bVar30 * auVar32._12_4_ | (uint)!bVar30 * 0x7f800000;
          auVar32 = vshufps_avx(auVar44,auVar44,0xb1);
          auVar32 = vminps_avx(auVar32,auVar44);
          auVar64 = vshufpd_avx(auVar32,auVar32,1);
          auVar32 = vminps_avx(auVar64,auVar32);
          uVar13 = vcmpps_avx512vl(auVar44,auVar32,0);
          local_2658 = (byte)uVar13 & local_2658;
          uVar69 = uVar22;
          if (local_2658 != 0) {
            uVar69 = (uint)local_2658;
          }
          uVar68 = 0;
          for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
            uVar68 = uVar68 + 1;
          }
        } while( true );
      }
    }
  }
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar58 = ZEXT3264(CONCAT428(uVar54,CONCAT424(uVar54,CONCAT420(uVar54,CONCAT416(uVar54,CONCAT412(
                                                  uVar54,CONCAT48(uVar54,CONCAT44(uVar54,uVar54)))))
                                               )));
  goto LAB_01d8c11e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }